

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangles.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  bov_window_t *window;
  bov_text_t *text;
  bov_text_t *pbVar3;
  bov_text_t *pbVar4;
  bov_points_t *points;
  bov_order_t *pbVar5;
  uint uVar6;
  int i;
  long lVar7;
  undefined1 auVar8 [16];
  GLubyte *label_msg_with_order [8];
  GLubyte *label_msg [8];
  bov_text_t *label_with_order [8];
  bov_text_t *label [8];
  GLubyte common_msg [23];
  GLfloat coord [6] [2];
  GLubyte *local_408 [8];
  GLubyte *local_3c8 [8];
  GLubyte local_388 [32];
  GLubyte local_368 [32];
  undefined8 auStack_348 [8];
  undefined8 auStack_308 [8];
  GLubyte local_2c8 [32];
  GLubyte local_2a8 [32];
  GLuint local_288 [8];
  GLubyte local_268 [32];
  GLubyte local_248 [32];
  GLubyte local_228 [32];
  GLubyte local_208 [32];
  GLubyte local_1e8 [32];
  GLubyte local_1c8 [32];
  GLubyte local_1a8 [32];
  undefined8 local_188;
  GLubyte aGStack_180 [40];
  GLubyte local_158 [48];
  GLubyte local_128 [48];
  GLubyte local_f8 [48];
  GLubyte local_c8 [48];
  GLubyte local_98 [48];
  GLfloat local_68 [2];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  window = bov_window_new(0x438,0x280,*argv);
  builtin_memcpy(local_2a8,"rendering points using",0x17);
  text = bov_text_new(local_2a8,0x88e4);
  (text->param).pos[0] = -1.0;
  (text->param).pos[1] = 0.9;
  builtin_memcpy(local_388,"bov_points_draw()",0x12);
  local_3c8[0] = local_388;
  builtin_memcpy(local_368 + 0x10,"aw()",5);
  builtin_memcpy(local_368,"bov_triangles_dr",0x10);
  local_3c8[1] = local_368;
  builtin_memcpy(local_228 + 0x10,"ip_draw()",10);
  builtin_memcpy(local_228,"bov_triangle_str",0x10);
  local_3c8[2] = local_228;
  builtin_memcpy(local_268 + 0x10,"_draw()",8);
  builtin_memcpy(local_268,"bov_triangle_fan",0x10);
  local_3c8[3] = local_268;
  builtin_memcpy(local_2c8,"bov_fast_points_draw()",0x17);
  local_3c8[4] = local_2c8;
  builtin_memcpy(local_248 + 0x10,"es_draw()",10);
  builtin_memcpy(local_248,"bov_fast_triangl",0x10);
  local_3c8[5] = local_248;
  builtin_memcpy(local_1c8,"bov_fast_triangle_strip_draw()",0x1f);
  local_3c8[6] = local_1c8;
  builtin_memcpy(local_1e8 + 0x10,"e_fan_draw()",0xd);
  builtin_memcpy(local_1e8,"bov_fast_triangl",0x10);
  local_3c8[7] = local_1e8;
  builtin_memcpy(local_208 + 0x10,"with_order()",0xd);
  builtin_memcpy(local_208,"bov_points_draw_",0x10);
  local_408[0] = local_208;
  builtin_memcpy(local_1a8 + 0x10,"aw_with_order()",0x10);
  builtin_memcpy(local_1a8,"bov_triangles_dr",0x10);
  local_408[1] = local_1a8;
  builtin_memcpy(local_f8 + 0x20,"er()",5);
  builtin_memcpy(local_f8 + 0x10,"ip_draw_with_ord",0x10);
  builtin_memcpy(local_f8,"bov_triangle_str",0x10);
  local_408[2] = local_f8;
  builtin_memcpy(local_158,"bov_triangle_fan_draw_with_order()",0x23);
  local_408[3] = local_158;
  builtin_memcpy(aGStack_180 + 8,"draw_with_order()",0x12);
  local_188._0_1_ = 'b';
  local_188._1_1_ = 'o';
  local_188._2_1_ = 'v';
  local_188._3_1_ = '_';
  local_188._4_1_ = 'f';
  local_188._5_1_ = 'a';
  local_188._6_1_ = 's';
  local_188._7_1_ = 't';
  builtin_memcpy(aGStack_180,"_points_",8);
  local_408[4] = (GLubyte *)&local_188;
  builtin_memcpy(local_128 + 0x20,"er()",5);
  builtin_memcpy(local_128 + 0x10,"es_draw_with_ord",0x10);
  builtin_memcpy(local_128,"bov_fast_triangl",0x10);
  local_408[5] = local_128;
  builtin_memcpy(local_98 + 0x20,"h_order()",10);
  builtin_memcpy(local_98 + 0x10,"e_strip_draw_wit",0x10);
  builtin_memcpy(local_98,"bov_fast_triangl",0x10);
  local_408[6] = local_98;
  builtin_memcpy(local_c8 + 0x20,"order()",8);
  builtin_memcpy(local_c8 + 0x10,"e_fan_draw_with_",0x10);
  builtin_memcpy(local_c8,"bov_fast_triangl",0x10);
  local_408[7] = local_c8;
  lVar7 = 0;
  do {
    pbVar3 = bov_text_new(local_3c8[lVar7],0x88e4);
    auStack_308[lVar7] = pbVar3;
    pbVar4 = bov_text_new(local_408[lVar7],0x88e4);
    auStack_348[lVar7] = pbVar4;
    (pbVar3->param).pos[0] = -0.425;
    (pbVar3->param).pos[1] = 0.9;
    (pbVar4->param).pos[0] = -0.425;
    (pbVar4->param).pos[1] = 0.9;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  local_48 = 0x4080000040800000;
  uStack_40 = 0x4000000040c00000;
  local_58 = 0x3f0000003f000000;
  uStack_50 = 0x4000000040000000;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  uStack_60 = 0x3f800000;
  points = bov_points_new(&local_68,6,0x88e4);
  (points->param).fillColor[0] = 0.05;
  (points->param).fillColor[1] = 0.1;
  (points->param).fillColor[2] = 0.2;
  (points->param).fillColor[3] = 0.6;
  (points->param).outlineWidth = 0.025;
  (points->param).width = 0.0;
  (points->param).outlineColor[0] = 0.3;
  (points->param).outlineColor[1] = 0.0;
  (points->param).outlineColor[2] = 0.0;
  (points->param).outlineColor[3] = 0.5;
  local_288[4] = 4;
  local_288[5] = 5;
  local_288[0] = 0;
  local_288[1] = 1;
  local_288[2] = 2;
  local_288[3] = 3;
  pbVar5 = bov_order_new(local_288,6,0x88e4);
  iVar2 = glfwWindowShouldClose(window->self);
  lVar7 = 0;
  while (iVar2 == 0) {
    dVar1 = window->wtime;
    bov_text_draw(window,text);
    uVar6 = (uint)((ulong)(long)dVar1 >> 1) & 0xf;
    if (uVar6 < 8) {
      bov_text_draw(window,*(bov_text_t **)((long)auStack_308 + (ulong)(uVar6 << 3)));
      (**(code **)((long)&PTR_bov_points_draw_001ad510 + (ulong)(uVar6 << 3)))(window,points,0);
    }
    else {
      bov_text_draw(window,(bov_text_t *)auStack_348[uVar6 - 8]);
      (*(code *)(&PTR_bov_points_draw_with_order_001ad550)[uVar6 - 8])
                (window,points,pbVar5,0,0x7fffffff);
    }
    bov_window_update(window);
    lVar7 = lVar7 + 1;
    iVar2 = glfwWindowShouldClose(window->self);
  }
  auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar8._0_8_ = lVar7;
  auVar8._12_4_ = 0x45300000;
  printf("Ended correctly - %.2f second, %lu frames, %.2f fps\n",SUB84(window->wtime,0),
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / window->wtime,lVar7);
  lVar7 = 0;
  do {
    bov_text_delete((bov_text_t *)auStack_308[lVar7]);
    bov_text_delete((bov_text_t *)auStack_348[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  bov_text_delete(text);
  bov_points_delete(points);
  bov_window_delete(window);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bov_window_t* window = bov_window_new(1080,640, argv[0]);

	const GLubyte common_msg[] = "rendering points using";
	bov_text_t* common_label = bov_text_new(common_msg,
	                                        GL_STATIC_DRAW);
	bov_text_set_pos(common_label, (GLfloat[2]) {-1.0, 0.9});

	// make an array of message
	const GLubyte* label_msg[8] = {
		(GLubyte[]){"bov_points_draw()"},
		(GLubyte[]){"bov_triangles_draw()"},
		(GLubyte[]){"bov_triangle_strip_draw()"},
		(GLubyte[]){"bov_triangle_fan_draw()"},
		(GLubyte[]){"bov_fast_points_draw()"},
		(GLubyte[]){"bov_fast_triangles_draw()"},
		(GLubyte[]){"bov_fast_triangle_strip_draw()"},
		(GLubyte[]){"bov_fast_triangle_fan_draw()"},
	};

	void (*functions[8])(bov_window_t* window,
	                     const bov_points_t* pts,
	                     GLint start,
	                     GLsizei count) = {
		bov_points_draw,
		bov_triangles_draw,
		bov_triangle_strip_draw,
		bov_triangle_fan_draw,
		bov_fast_points_draw,
		bov_fast_triangles_draw,
		bov_fast_triangle_strip_draw,
		bov_fast_triangle_fan_draw,
	};

	const GLubyte* label_msg_with_order[8] = {
		(GLubyte[]){"bov_points_draw_with_order()"},
		(GLubyte[]){"bov_triangles_draw_with_order()"},
		(GLubyte[]){"bov_triangle_strip_draw_with_order()"},
		(GLubyte[]){"bov_triangle_fan_draw_with_order()"},
		(GLubyte[]){"bov_fast_points_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangles_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangle_strip_draw_with_order()"},
		(GLubyte[]){"bov_fast_triangle_fan_draw_with_order()"},
	};

	void (*functions_with_order[8])(bov_window_t* window,
                                    const bov_points_t* pts,
                                    const bov_order_t* order,
                                    GLint start,
                                    GLsizei count) = {
		bov_points_draw_with_order,
		bov_triangles_draw_with_order,
		bov_triangle_strip_draw_with_order,
		bov_triangle_fan_draw_with_order,
		bov_fast_points_draw_with_order,
		bov_fast_triangles_draw_with_order,
		bov_fast_triangle_strip_draw_with_order,
		bov_fast_triangle_fan_draw_with_order,
	};

	// with an array of corresponding labels
	bov_text_t* label[8];
	bov_text_t* label_with_order[8];
	for(int i=0; i<8; i++) {
		label[i] = bov_text_new(label_msg[i], GL_STATIC_DRAW);
		label_with_order[i] = bov_text_new(label_msg_with_order[i], GL_STATIC_DRAW);
		bov_text_set_pos(label[i], (GLfloat[2]) {-1.0 + 23 * 0.025, 0.9});
		bov_text_set_pos(label_with_order[i], (GLfloat[2]) {-1.0 + 23 * 0.025, 0.9});
	}

	/*
	GLfloat coord[][2] = {
		{0, 0},
		{1, 0},
		{0.6*0.8660254582502496, 0.6*0.49999990566243624},
		{0.5000001886751096, 0.8660252948527859},
		{0.6*3.2679489653813835e-07, 0.6*0.9999999999999466},
		{-0.49999962264970943, 0.8660256216476209},
		{-0.6*0.8660251314552299, 0.6*0.5000004716877294},
		{-0.9999999999997864, 6.535897930762419e-07},
		{-0.6*0.8660257850448994, -0.6*0.4999993396369297},
		{-0.5000007547002964, -0.8660249680575809},
		{-0.6*9.803846891701863e-07, -0.6*0.9999999999995194},
		{0.49999905662409616, -0.8660259484420856},
		{0.6*0.86602480465984, -0.6*0.5000010377128091},
		{1, 0},
	};*/
	GLfloat coord[][2] = {
		{0, 0},
		{1, 0},
		{0.5, 0.5},
		{2, 2},
		{4, 4},
		{6, 2}
	};

	//bov_points_t* pointset = bov_points_new(coord, 14, GL_STATIC_DRAW);
	bov_points_t* pointset = bov_points_new(coord, 6, GL_STATIC_DRAW);
	bov_points_set_color(pointset, (float[4]) {0.05, 0.1, 0.2, 0.6});
	bov_points_set_outline_width(pointset, 0.025);
	bov_points_set_width(pointset, 0.0);
	bov_points_set_outline_color(pointset, (GLfloat[4]) {0.3, 0.0, 0.0, 0.5});

	/*
	bov_order_t* order = bov_order_new((GLuint[14]) {0, 2, 4, 6, 8, 14, 12, 1, 3, 5, 7, 9, 11, 13},
	                                    10,
	                                    GL_STATIC_DRAW);*/
	bov_order_t* order = bov_order_new((GLuint[6]) {0, 1, 2, 3, 4, 5}, 6, GL_STATIC_DRAW);

	unsigned long frameCount = 0;
	while(!bov_window_should_close(window)) {
		double wtime = bov_window_get_time(window);

		bov_text_draw(window, common_label);
		unsigned mode = (unsigned) wtime / 2 % 16;

		if(mode<8) {
			bov_text_draw(window, label[mode]);
			functions[mode](window, pointset, 0, BOV_TILL_END);
		}
		else {
			bov_text_draw(window, label_with_order[mode-8]);
			functions_with_order[mode-8](window, pointset, order, 0, BOV_TILL_END);
		}

		bov_window_update(window);

		frameCount++;
	}

	printf("Ended correctly - %.2f second, %lu frames, %.2f fps\n",
	       bov_window_get_time(window),
	       frameCount,
	       frameCount / bov_window_get_time(window));

	for(int i=0; i<8; i++) {
		bov_text_delete(label[i]);
		bov_text_delete(label_with_order[i]);
	}
	bov_text_delete(common_label);

	bov_points_delete(pointset);

	bov_window_delete(window);

	return EXIT_SUCCESS;
}